

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

pair<mjs::token,_unsigned_long> * __thiscall
mjs::anon_unknown_2::skip_whitespace
          (pair<mjs::token,_unsigned_long> *__return_storage_ptr__,anon_unknown_2 *this,
          wstring_view text,size_t token_start,version ver)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  const_reference pvVar3;
  bool local_81;
  token local_60;
  wchar_t *local_38;
  size_t token_end;
  wchar_t *pwStack_28;
  version ver_local;
  size_t token_start_local;
  wstring_view text_local;
  
  token_end._4_4_ = (version)token_start;
  local_38 = text._M_str;
  text_local._M_len = text._M_len;
  pwStack_28 = local_38;
  token_start_local = (size_t)this;
  text_local._M_str = (wchar_t *)__return_storage_ptr__;
  while( true ) {
    pwVar1 = local_38;
    pwVar2 = (wchar_t *)
             std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size
                       ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&token_start_local
                       );
    local_81 = false;
    if (pwVar1 < pwVar2) {
      pvVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                          &token_start_local,(size_type)local_38);
      local_81 = is_whitespace((char16_t)*pvVar3,token_end._4_4_);
    }
    if (local_81 == false) break;
    local_38 = (wchar_t *)((long)local_38 + 1);
  }
  token::token(&local_60,whitespace);
  std::pair<mjs::token,_unsigned_long>::pair<mjs::token,_unsigned_long_&,_true>
            (__return_storage_ptr__,&local_60,(unsigned_long *)&local_38);
  token::~token(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::pair<token, size_t> skip_whitespace(const std::wstring_view text, const size_t token_start, version ver) {
    auto token_end = token_start;
    while (token_end < text.size() && is_whitespace(static_cast<char16_t>(text[token_end]), ver)) {
        ++token_end;
    }
    return { token{token_type::whitespace}, token_end };
}